

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O0

void printError(uint32_t lineno,string *error)

{
  ostream *poVar1;
  string *error_local;
  uint32_t lineno_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&g_Options);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lineno);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::operator<<(poVar1,(string *)error);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printError(uint32_t lineno, const string& error)
{
	cerr << g_Options.inputFile << "(" << lineno << "): " << error << endl;
}